

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O1

LE_EulerAngles * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator*
          (LE_EulerAngles *__return_storage_ptr__,LE_EulerAngles *this,KFLOAT64 Value)

{
  KFIXED<char,_(unsigned_char)__x03_> local_70;
  KFIXED<char,_(unsigned_char)__x03_> local_60;
  KFIXED<char,_(unsigned_char)__x03_> local_50;
  KFIXED<char,_(unsigned_char)__x03_> local_40;
  KFIXED<char,_(unsigned_char)__x03_> local_30;
  KFIXED<char,_(unsigned_char)__x03_> local_20;
  
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__LE_EulerAngles_0022e058;
  (__return_storage_ptr__->m_Psi).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_0022b238;
  (__return_storage_ptr__->m_Psi).m_Val = (this->m_Psi).m_Val;
  (__return_storage_ptr__->m_Theta).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_0022b238;
  (__return_storage_ptr__->m_Theta).m_Val = (this->m_Theta).m_Val;
  (__return_storage_ptr__->m_Phi).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_0022b238;
  (__return_storage_ptr__->m_Phi).m_Val = (this->m_Phi).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_50,Value);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_20,&__return_storage_ptr__->m_Psi);
  DataTypeBase::~DataTypeBase(&local_20.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_60,Value);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_30,&__return_storage_ptr__->m_Theta);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_60.super_DataTypeBase);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_70,Value);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_40,&__return_storage_ptr__->m_Phi);
  DataTypeBase::~DataTypeBase(&local_40.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
  return __return_storage_ptr__;
}

Assistant:

LE_EulerAngles KDIS::DATA_TYPE::LE_EulerAngles::operator * ( KFLOAT64 Value ) const
{
    LE_EulerAngles tmp = *this;
    tmp.m_Psi   = tmp.m_Psi * Value;
    tmp.m_Theta = tmp.m_Theta * Value;
    tmp.m_Phi   = tmp.m_Phi * Value;
    return tmp;
}